

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
fmt::v9::
sprintf<char[45],short,char*,char_const*,char_const*,char_const*,char_const*,char_const*,char*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char*,char_const*,char_const*,char>
          (char (*fmt) [45],short *args,char **args_1,char **args_2,char **args_3,char **args_4,
          char **args_5,char **args_6,char **args_7,char **args_8,char **args_9,char **args_10,
          char **args_11,char **args_12,char **args_13,char **args_14,char **args_15,char **args_16)

{
  size_t sVar1;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char **in_stack_00000050;
  char **in_stack_00000058;
  char **in_stack_00000060;
  char **in_stack_00000068;
  char **in_stack_00000110;
  char **in_stack_00000118;
  char **in_stack_00000120;
  char **in_stack_00000128;
  char **in_stack_00000130;
  char **in_stack_00000138;
  char **in_stack_00000140;
  char **in_stack_00000148;
  char **in_stack_00000150;
  char **in_stack_00000158;
  char **in_stack_00000160;
  char **in_stack_00000168;
  short *args_17;
  format_arg local_2e8 [16];
  basic_string_view<char> *in_stack_ffffffffffffff18;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>
  in_stack_ffffffffffffff20;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> local_c0;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_68;
  undefined8 local_60;
  short *local_50;
  format_arg *local_48;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *local_40;
  format_arg *local_38;
  
  args_17 = (short *)&local_68;
  local_68 = in_RSI;
  local_50 = args_17;
  sVar1 = std::char_traits<char>::length((char_type *)0x557fc1);
  *(size_t *)(args_17 + 4) = sVar1;
  local_b0 = local_68;
  local_a8 = local_60;
  make_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,char>,short_const&,char*const&,char_const*const&,char_const*const&,char_const*const&,char_const*const&,char_const*const&,char*const&,char_const*const&,char_const*const&,char_const*const&,char_const*const&,char_const*const&,char_const*const&,char*const&,char_const*const&,char_const*const&>
            (args_17,in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
             in_stack_00000110,in_stack_00000118,in_stack_00000120,in_stack_00000128,
             in_stack_00000130,in_stack_00000138,in_stack_00000140,in_stack_00000148,
             in_stack_00000150,in_stack_00000158,in_stack_00000160,in_stack_00000168);
  local_40 = &local_c0;
  local_48 = local_2e8;
  local_38 = local_48;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::basic_format_args
            (local_40,0x8000000000000011,local_48);
  vsprintf<fmt::v9::basic_string_view<char>,char>
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
  return in_RDI;
}

Assistant:

inline auto sprintf(const S& fmt, const T&... args) -> std::basic_string<Char> {
  using context = basic_printf_context_t<Char>;
  return vsprintf(detail::to_string_view(fmt),
                  fmt::make_format_args<context>(args...));
}